

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deconvolutiondepthwise.cpp
# Opt level: O0

int __thiscall ncnn::DeconvolutionDepthWise::load_model(DeconvolutionDepthWise *this,ModelBin *mb)

{
  bool bVar1;
  undefined8 *in_RSI;
  Mat *in_RDI;
  Mat *in_stack_ffffffffffffff50;
  Mat *m;
  Mat local_98;
  undefined1 local_50 [56];
  undefined8 *local_18;
  int local_4;
  
  local_18 = in_RSI;
  (**(code **)*in_RSI)(local_50,in_RSI,*(undefined4 *)&in_RDI[3].data,0);
  Mat::operator=(in_RDI,in_stack_ffffffffffffff50);
  Mat::~Mat((Mat *)0x154608);
  bVar1 = Mat::empty(in_stack_ffffffffffffff50);
  if (bVar1) {
    local_4 = -100;
  }
  else {
    if (*(int *)((long)&in_RDI[2].cstep + 4) != 0) {
      m = &local_98;
      (**(code **)*local_18)(m,local_18,(int)in_RDI[2].elemsize,1);
      Mat::operator=(in_RDI,m);
      Mat::~Mat((Mat *)0x1546aa);
      bVar1 = Mat::empty(m);
      if (bVar1) {
        return -100;
      }
    }
    local_4 = 0;
  }
  return local_4;
}

Assistant:

int DeconvolutionDepthWise::load_model(const ModelBin& mb)
{
    weight_data = mb.load(weight_data_size, 0);
    if (weight_data.empty())
        return -100;

    if (bias_term)
    {
        bias_data = mb.load(num_output, 1);
        if (bias_data.empty())
            return -100;
    }

    return 0;
}